

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinref.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::JoinRef::Copy(JoinRef *this)

{
  JoinRefType JVar1;
  JoinType JVar2;
  bool bVar3;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar6;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var7;
  pointer pTVar8;
  pointer pJVar9;
  pointer pPVar10;
  long in_RSI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *col;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_40;
  _Head_base<0UL,_duckdb::JoinRef_*,_false> local_38;
  
  local_38._M_head_impl = (JoinRef *)operator_new(0xc0);
  JVar1 = *(JoinRefType *)(in_RSI + 0x81);
  ((local_38._M_head_impl)->super_TableRef).type = JOIN;
  ((local_38._M_head_impl)->super_TableRef).alias._M_dataplus._M_p =
       (pointer)&((local_38._M_head_impl)->super_TableRef).alias.field_2;
  ((local_38._M_head_impl)->super_TableRef).alias._M_string_length = 0;
  ((local_38._M_head_impl)->super_TableRef).alias.field_2._M_local_buf[0] = '\0';
  ((local_38._M_head_impl)->super_TableRef).sample.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_> =
       (_Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>)0x0;
  ((local_38._M_head_impl)->super_TableRef).query_location.index = 0xffffffffffffffff;
  ((local_38._M_head_impl)->super_TableRef).column_name_alias.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_38._M_head_impl)->super_TableRef).column_name_alias.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_38._M_head_impl)->super_TableRef).column_name_alias.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_38._M_head_impl)->super_TableRef).external_dependency.internal.
  super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ((local_38._M_head_impl)->super_TableRef).external_dependency.internal.
  super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_38._M_head_impl)->super_TableRef)._vptr_TableRef = (_func_int **)&PTR__JoinRef_02451838;
  ((local_38._M_head_impl)->condition).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )0x0;
  ((local_38._M_head_impl)->left).
  super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_> =
       (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)0x0;
  ((local_38._M_head_impl)->right).
  super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_> =
       (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)0x0;
  (local_38._M_head_impl)->type = INNER;
  (local_38._M_head_impl)->ref_type = JVar1;
  (local_38._M_head_impl)->delim_flipped = false;
  ((local_38._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_38._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_38._M_head_impl)->using_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_38._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_38._M_head_impl)->using_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_38._M_head_impl)->using_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar8 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      (in_RSI + 0x68));
  (*pTVar8->_vptr_TableRef[4])(&local_40,pTVar8);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  _Var7._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (TableRef *)0x0;
  _Var4._M_head_impl =
       (pJVar9->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pJVar9->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var4._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_TableRef + 8))();
    if (local_40._M_head_impl != (TableRef *)0x0) {
      (*(local_40._M_head_impl)->_vptr_TableRef[1])();
    }
  }
  pTVar8 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      (in_RSI + 0x70));
  (*pTVar8->_vptr_TableRef[4])(&local_40,pTVar8);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  _Var7._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (TableRef *)0x0;
  _Var4._M_head_impl =
       (pJVar9->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pJVar9->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var4._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_TableRef + 8))();
    if (local_40._M_head_impl != (TableRef *)0x0) {
      (*((BaseExpression *)&(local_40._M_head_impl)->_vptr_TableRef)->_vptr_BaseExpression[1])();
    }
  }
  if (*(long *)(in_RSI + 0x78) != 0) {
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)(in_RSI + 0x78));
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_40,pPVar10);
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_38);
    _Var4._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (TableRef *)0x0;
    _Var5._M_head_impl =
         (pJVar9->condition).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pJVar9->condition).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)_Var4._M_head_impl;
    if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
      if (local_40._M_head_impl != (TableRef *)0x0) {
        (*((BaseExpression *)&(local_40._M_head_impl)->_vptr_TableRef)->_vptr_BaseExpression[1])();
      }
    }
  }
  JVar2 = *(JoinType *)(in_RSI + 0x80);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  pJVar9->type = JVar2;
  JVar1 = *(JoinRefType *)(in_RSI + 0x81);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  pJVar9->ref_type = JVar1;
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  ::std::__cxx11::string::_M_assign((string *)&(pJVar9->super_TableRef).alias);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pJVar9->using_columns,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(in_RSI + 0x88));
  bVar3 = *(bool *)(in_RSI + 0xb8);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  pJVar9->delim_flipped = bVar3;
  this_00 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              **)(in_RSI + 0xa0);
  puVar6 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             **)(in_RSI + 0xa8);
  if (this_00 != puVar6) {
    do {
      pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                         ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *
                          )&local_38);
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(this_00);
      (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_40,pPVar10);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pJVar9->duplicate_eliminated_columns,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_40);
      if (local_40._M_head_impl != (TableRef *)0x0) {
        (*((BaseExpression *)&(local_40._M_head_impl)->_vptr_TableRef)->_vptr_BaseExpression[1])();
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar6);
  }
  (this->super_TableRef)._vptr_TableRef = (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> JoinRef::Copy() {
	auto copy = make_uniq<JoinRef>(ref_type);
	copy->left = left->Copy();
	copy->right = right->Copy();
	if (condition) {
		copy->condition = condition->Copy();
	}
	copy->type = type;
	copy->ref_type = ref_type;
	copy->alias = alias;
	copy->using_columns = using_columns;
	copy->delim_flipped = delim_flipped;
	for (auto &col : duplicate_eliminated_columns) {
		copy->duplicate_eliminated_columns.emplace_back(col->Copy());
	}
	return std::move(copy);
}